

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutInfo * __thiscall QDockAreaLayout::info(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  qsizetype qVar4;
  QDockAreaLayoutInfo *pQVar5;
  QList<int> *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int index;
  QList<int> *in_stack_ffffffffffffffb0;
  QList<int> *path_00;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd8;
  QList<int> *in_stack_ffffffffffffffe0;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  path_00 = in_RDI;
  piVar3 = QList<int>::first(in_stack_ffffffffffffffb0);
  iVar1 = *piVar3;
  qVar4 = QList<int>::size(in_RSI);
  if (qVar4 == 1) {
    pQVar5 = (QDockAreaLayoutInfo *)((long)in_RDI + (long)iVar1 * 0x70 + 0x40);
  }
  else {
    QList<int>::mid(in_stack_ffffffffffffffe0,(qsizetype)in_stack_ffffffffffffffd8,
                    (qsizetype)path_00);
    pQVar5 = QDockAreaLayoutInfo::info(in_stack_ffffffffffffffd8,path_00);
    QList<int>::~QList((QList<int> *)0x5782b9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayout::info(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);

    if (path.size() == 1)
        return &docks[index];

    return docks[index].info(path.mid(1));
}